

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

uint pututf8(ly_ctx *ctx,char *dst,int32_t value)

{
  byte bVar1;
  
  bVar1 = (byte)value;
  if (value < 0x80) {
    if ((0x1f < value) || (((uint)value < 0xe && ((0x2600U >> (value & 0x1fU) & 1) != 0)))) {
      *dst = bVar1;
      return 1;
    }
  }
  else {
    if (value < 0x800) {
      *dst = (byte)((uint)value >> 6) | 0xc0;
      dst[1] = bVar1 & 0x3f | 0x80;
      return 2;
    }
    if (value < 0xfffe) {
      if (0x1f < value - 0xfdd0U && (value & 0xf800U) != 0xd800) {
        *dst = (byte)((uint)value >> 0xc) | 0xe0;
        dst[1] = (byte)((uint)value >> 6) & 0x3f | 0x80;
        dst[2] = bVar1 & 0x3f | 0x80;
        return 3;
      }
    }
    else if ((~value & 0xffeU) != 0 && value < 0x10fffe) {
      *dst = (byte)((uint)value >> 0x12) | 0xf0;
      dst[1] = (byte)((uint)value >> 0xc) & 0x3f | 0x80;
      dst[2] = (byte)((uint)value >> 6) & 0x3f | 0x80;
      dst[3] = bVar1 & 0x3f | 0x80;
      return 4;
    }
  }
  ly_vlog(ctx,LYE_XML_INCHAR,LY_VLOG_NONE,(void *)0x0,0);
  ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Invalid UTF-8 value 0x%08x",(ulong)(uint)value);
  return 0;
}

Assistant:

unsigned int
pututf8(struct ly_ctx *ctx, char *dst, int32_t value)
{
    if (value < 0x80) {
        /* one byte character */
        if (value < 0x20 &&
                value != 0x09 &&
                value != 0x0a &&
                value != 0x0d) {
            goto error;
        }

        dst[0] = value;
        return 1;
    } else if (value < 0x800) {
        /* two bytes character */
        dst[0] = 0xc0 | (value >> 6);
        dst[1] = 0x80 | (value & 0x3f);
        return 2;
    } else if (value < 0xfffe) {
        /* three bytes character */
        if (((value & 0xf800) == 0xd800) ||
                (value >= 0xfdd0 && value <= 0xfdef)) {
            /* exclude surrogate blocks %xD800-DFFF */
            /* exclude noncharacters %xFDD0-FDEF */
            goto error;
        }

        dst[0] = 0xe0 | (value >> 12);
        dst[1] = 0x80 | ((value >> 6) & 0x3f);
        dst[2] = 0x80 | (value & 0x3f);

        return 3;
    } else if (value < 0x10fffe) {
        if ((value & 0xffe) == 0xffe) {
            /* exclude noncharacters %xFFFE-FFFF, %x1FFFE-1FFFF, %x2FFFE-2FFFF, %x3FFFE-3FFFF, %x4FFFE-4FFFF,
             * %x5FFFE-5FFFF, %x6FFFE-6FFFF, %x7FFFE-7FFFF, %x8FFFE-8FFFF, %x9FFFE-9FFFF, %xAFFFE-AFFFF,
             * %xBFFFE-BFFFF, %xCFFFE-CFFFF, %xDFFFE-DFFFF, %xEFFFE-EFFFF, %xFFFFE-FFFFF, %x10FFFE-10FFFF */
            goto error;
        }
        /* four bytes character */
        dst[0] = 0xf0 | (value >> 18);
        dst[1] = 0x80 | ((value >> 12) & 0x3f);
        dst[2] = 0x80 | ((value >> 6) & 0x3f);
        dst[3] = 0x80 | (value & 0x3f);

        return 4;
    }

error:
    /* out of range */
    LOGVAL(ctx, LYE_XML_INCHAR, LY_VLOG_NONE, NULL, NULL);
    LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid UTF-8 value 0x%08x", value);
    return 0;
}